

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O2

xml_node __thiscall
NULLCPugiXML::xml_node__insert_child_before1
          (NULLCPugiXML *this,NULLCArray name,xml_node *node,xml_node *ptr)

{
  xml_node local_20;
  
  if (this == (NULLCPugiXML *)0x0) {
    nullcThrowError("name is empty",name.ptr);
    local_20._root = (xml_node_struct *)0x0;
    pugi::xml_node::xml_node(&local_20);
  }
  else {
    pugi::xml_node::xml_node(&local_20);
    local_20 = pugi::xml_node::insert_child_before
                         (&node->node,(char_t *)this,
                          (xml_node *)CONCAT44((int)((ulong)register0x00000010 >> 0x20),name.len));
  }
  return (xml_node)local_20._root;
}

Assistant:

xml_node xml_node__insert_child_before1(NULLCArray name, xml_node* node, xml_node* ptr)
	{
		if(!name.ptr)
		{
			nullcThrowError("name is empty");
			return xml_node();
		}
		xml_node ret;
		ret.node = ptr->node.insert_child_before(name.ptr, node->node);
		return ret;
	}